

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsq.hpp
# Opt level: O3

void __thiscall
tf::UnboundedTaskQueue<tf::Node_*>::push(UnboundedTaskQueue<tf::Node_*> *this,Node *o)

{
  ulong b;
  long t;
  Array *a;
  
  b = (this->_bottom).super___atomic_base<long>._M_i;
  t = (this->_top).super___atomic_base<long>._M_i;
  a = (this->_array)._M_b._M_p;
  if (a->C <= (long)(b - t)) {
    a = resize_array(this,a,b,t);
  }
  a->S[a->M & b]._M_b._M_p = o;
  (this->_bottom).super___atomic_base<long>._M_i = b + 1;
  return;
}

Assistant:

void UnboundedTaskQueue<T>::push(T o) {

  int64_t b = _bottom.load(std::memory_order_relaxed);
  int64_t t = _top.load(std::memory_order_acquire);
  Array* a = _array.load(std::memory_order_relaxed);

  // queue is full with one additional item (b-t+1)
  if TF_UNLIKELY(a->capacity() - 1 < (b - t)) {
    a = resize_array(a, b, t);
  }